

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo_unix.cpp
# Opt level: O0

QHostInfo QHostInfoAgent::fromName(QString *hostName)

{
  bool bVar1;
  QHostInfoPrivate *in_RDI;
  long in_FS_OFFSET;
  QHostAddress address;
  QHostInfo results;
  QString *in_stack_ffffffffffffffb8;
  QHostInfoPrivate *pQVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QHostAddress *address_00;
  QString *hostName_00;
  
  hostName_00 = *(QString **)(in_FS_OFFSET + 0x28);
  address_00 = (QHostAddress *)0xaaaaaaaaaaaaaaaa;
  pQVar2 = in_RDI;
  QHostInfo::QHostInfo
            ((QHostInfo *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (int)((ulong)in_RDI >> 0x20));
  maybeRefreshResolver();
  QHostAddress::QHostAddress((QHostAddress *)in_RDI);
  bVar1 = QHostAddress::setAddress((QHostAddress *)in_RDI,in_stack_ffffffffffffffb8);
  if (bVar1) {
    reverseLookup(address_00);
  }
  else {
    lookup(hostName_00);
  }
  QHostAddress::~QHostAddress((QHostAddress *)0x3598e2);
  QHostInfo::~QHostInfo((QHostInfo *)in_RDI);
  if (*(QString **)(in_FS_OFFSET + 0x28) == hostName_00) {
    return (QHostInfo)pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo QHostInfoAgent::fromName(const QString &hostName)
{
    QHostInfo results;

#if defined(QHOSTINFO_DEBUG)
    qDebug("QHostInfoAgent::fromName(%s) looking up...",
           hostName.toLatin1().constData());
#endif

    maybeRefreshResolver();

    QHostAddress address;
    if (address.setAddress(hostName))
        return reverseLookup(address);

    return lookup(hostName);
}